

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Util.hpp
# Opt level: O0

int __thiscall Centaurus::ATNPath::count(ATNPath *this,Identifier *id,int index)

{
  difference_type dVar1;
  pair<Centaurus::Identifier,_int> local_60;
  __normal_iterator<const_std::pair<Centaurus::Identifier,_int>_*,_std::vector<std::pair<Centaurus::Identifier,_int>,_std::allocator<std::pair<Centaurus::Identifier,_int>_>_>_>
  local_30;
  __normal_iterator<const_std::pair<Centaurus::Identifier,_int>_*,_std::vector<std::pair<Centaurus::Identifier,_int>,_std::allocator<std::pair<Centaurus::Identifier,_int>_>_>_>
  local_28;
  int local_1c;
  Identifier *pIStack_18;
  int index_local;
  Identifier *id_local;
  ATNPath *this_local;
  
  local_1c = index;
  pIStack_18 = id;
  id_local = (Identifier *)this;
  local_28._M_current =
       (pair<Centaurus::Identifier,_int> *)
       std::
       vector<std::pair<Centaurus::Identifier,_int>,_std::allocator<std::pair<Centaurus::Identifier,_int>_>_>
       ::cbegin(&this->
                 super_vector<std::pair<Centaurus::Identifier,_int>,_std::allocator<std::pair<Centaurus::Identifier,_int>_>_>
               );
  local_30._M_current =
       (pair<Centaurus::Identifier,_int> *)
       std::
       vector<std::pair<Centaurus::Identifier,_int>,_std::allocator<std::pair<Centaurus::Identifier,_int>_>_>
       ::cend(&this->
               super_vector<std::pair<Centaurus::Identifier,_int>,_std::allocator<std::pair<Centaurus::Identifier,_int>_>_>
             );
  std::pair<Centaurus::Identifier,_int>::pair<int_&,_true>(&local_60,pIStack_18,&local_1c);
  dVar1 = std::
          count<__gnu_cxx::__normal_iterator<std::pair<Centaurus::Identifier,int>const*,std::vector<std::pair<Centaurus::Identifier,int>,std::allocator<std::pair<Centaurus::Identifier,int>>>>,std::pair<Centaurus::Identifier,int>>
                    (local_28,local_30,&local_60);
  std::pair<Centaurus::Identifier,_int>::~pair(&local_60);
  return (int)dVar1;
}

Assistant:

int count(const Identifier& id, int index) const
    {
        return std::count(cbegin(), cend(), std::pair<Identifier, int>(id, index));
    }